

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

Frame * __thiscall rw::Frame::removeChild(Frame *this)

{
  LLLink *pLVar1;
  uint8 *puVar2;
  byte bVar3;
  void *pvVar4;
  Frame *pFVar5;
  LLLink *pLVar6;
  long lVar7;
  Frame **ppFVar8;
  Frame *pFVar9;
  
  pvVar4 = (this->object).parent;
  pFVar5 = *(Frame **)((long)pvVar4 + 0xb0);
  if (pFVar5 == this) {
    ppFVar8 = (Frame **)((long)pvVar4 + 0xb0);
  }
  else {
    do {
      pFVar9 = pFVar5;
      pFVar5 = pFVar9->next;
    } while (pFVar5 != this);
    ppFVar8 = &pFVar9->next;
  }
  *ppFVar8 = this->next;
  this->next = (Frame *)0x0;
  (this->object).parent = (void *)0x0;
  setHierarchyRoot(this,this);
  lVar7 = engine;
  pFVar5 = this->root;
  bVar3 = (pFVar5->object).privateFlags;
  if ((bVar3 & 3) == 0) {
    pLVar1 = (LLLink *)(engine + 0x10);
    pLVar6 = *(LLLink **)(engine + 0x10);
    (pFVar5->inDirtyList).next = pLVar6;
    (pFVar5->inDirtyList).prev = pLVar1;
    pLVar6->prev = &pFVar5->inDirtyList;
    *(LLLink **)(lVar7 + 0x10) = &pFVar5->inDirtyList;
  }
  (pFVar5->object).privateFlags = bVar3 | 3;
  puVar2 = &(this->object).privateFlags;
  *puVar2 = *puVar2 | 0xc;
  return this;
}

Assistant:

Frame*
Frame::removeChild(void)
{
	Frame *parent = this->getParent();
	Frame *child = parent->child;
	if(child == this)
		parent->child = this->next;
	else{
		while(child->next != this)
			child = child->next;
		child->next = this->next;
	}
	this->object.parent = this->next = nil;
	// give the hierarchy a new root
	this->setHierarchyRoot(this);
	this->updateObjects();
	return this;
}